

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eglwLibrary.cpp
# Opt level: O0

FunctionLibrary * eglw::anon_unknown_0::createStaticLibrary(void)

{
  StaticFunctionLibrary *this;
  
  this = (StaticFunctionLibrary *)operator_new(0x38);
  tcu::StaticFunctionLibrary::StaticFunctionLibrary(this,createStaticLibrary::s_staticEntries,0x2c);
  return &this->super_FunctionLibrary;
}

Assistant:

tcu::FunctionLibrary* createStaticLibrary (void)
{
#if defined(DEQP_EGL_DIRECT_LINK)
	static tcu::StaticFunctionLibrary::Entry s_staticEntries[] =
	{
#	if defined(EGL_VERSION_1_5)
#		include "eglwStaticLibrary15.inl"
#	elif defined(EGL_VERSION_1_4)
#		include "eglwStaticLibrary14.inl"
#	endif
	};
	return new tcu::StaticFunctionLibrary(s_staticEntries, DE_LENGTH_OF_ARRAY(s_staticEntries));
#else
	return new tcu::StaticFunctionLibrary(DE_NULL, 0);
#endif
}